

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.h
# Opt level: O0

void __thiscall rtb::Concurrency::Queue<int>::~Queue(Queue<int> *this)

{
  Queue<int> *this_local;
  
  std::condition_variable::~condition_variable(&this->cond_);
  std::
  map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  ::~map(&this->subscribersMissingRead_);
  std::
  map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
  ::~map(&this->subscribersNextRead_);
  std::__cxx11::list<std::optional<int>,_std::allocator<std::optional<int>_>_>::~list(&this->queue_)
  ;
  return;
}

Assistant:

Queue() = default;